

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall GCPtr<symbols::ErrorObject>::~GCPtr(GCPtr<symbols::ErrorObject> *this)

{
  int iVar1;
  pointer pGVar2;
  _List_iterator<GCInfo<symbols::ErrorObject>_> local_18;
  iterator p;
  GCPtr<symbols::ErrorObject> *this_local;
  
  p._M_node = (_List_node_base *)this;
  std::_List_iterator<GCInfo<symbols::ErrorObject>_>::_List_iterator(&local_18);
  local_18._M_node = (_List_node_base *)findPtrInfo(this,this->addr);
  pGVar2 = std::_List_iterator<GCInfo<symbols::ErrorObject>_>::operator->(&local_18);
  if (pGVar2->refcount != 0) {
    pGVar2 = std::_List_iterator<GCInfo<symbols::ErrorObject>_>::operator->(&local_18);
    pGVar2->refcount = pGVar2->refcount - 1;
  }
  iVar1 = gclistSize();
  if (gcthreshold <= iVar1) {
    collect();
  }
  return;
}

Assistant:

GCPtr<T>::~GCPtr(){

    typename list<GCInfo<T>>::iterator p;

    p = findPtrInfo(addr);
    if(p->refcount) p->refcount--;
    #ifdef DISPLAY
        cout << "GCPtr going out of scope.\n";
    #endif
    // Collect garbage when a number of pointers that have gone out of scope
    // reaches gcthreshold
    if(gclistSize() >= gcthreshold)
        collect();
}